

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O1

ze_result_t
validation_layer::zesRasClearStateExp(zes_ras_handle_t hRas,zes_ras_error_category_exp_t category)

{
  long lVar1;
  code *pcVar2;
  long lVar3;
  long *plVar4;
  ze_result_t zVar5;
  ze_result_t result;
  long lVar6;
  ze_result_t unaff_EBP;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  ze_result_t local_8c;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar6 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zesRasClearStateExp(hRas, category)","");
  if (*(char *)(lVar6 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar6 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar2 = *(code **)(context + 0xcc8);
  if (pcVar2 == (code *)0x0) {
    zVar5 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar6 = *(long *)(context + 0xd30);
    lVar3 = *(long *)(context + 0xd38);
    uVar8 = lVar3 - lVar6 >> 3;
    bVar9 = lVar3 != lVar6;
    local_8c = unaff_EBP;
    if (bVar9) {
      uVar7 = 1;
      do {
        plVar4 = *(long **)(*(long *)(*(long *)(context + 0xd30) + -8 + uVar7 * 8) + 8);
        local_8c = (**(code **)(*plVar4 + 0x850))(plVar4,hRas,category);
        if (local_8c != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zesRasClearStateExp",local_8c);
          break;
        }
        bVar9 = uVar7 < uVar8;
        lVar1 = (-(ulong)(uVar8 == 0) - uVar8) + uVar7;
        uVar7 = uVar7 + 1;
        local_8c = unaff_EBP;
      } while (lVar1 != 0);
    }
    lVar1 = context;
    if (bVar9) {
      return local_8c;
    }
    if ((*(char *)(context + 4) == '\x01') &&
       (zVar5 = ZESHandleLifetimeValidation::zesRasClearStateExpPrologue
                          ((ZESHandleLifetimeValidation *)(*(long *)(context + 0xd48) + 8),hRas,
                           category), zVar5 != ZE_RESULT_SUCCESS)) {
      logAndPropagateResult("zesRasClearStateExp",zVar5);
      return zVar5;
    }
    zVar5 = (*pcVar2)(hRas,category);
    bVar9 = lVar3 != lVar6;
    if (bVar9) {
      uVar7 = 1;
      do {
        plVar4 = *(long **)(*(long *)(*(long *)(lVar1 + 0xd30) + -8 + uVar7 * 8) + 8);
        result = (**(code **)(*plVar4 + 0x858))(plVar4,hRas,category,zVar5);
        if (result != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zesRasClearStateExp",result);
          local_8c = result;
          break;
        }
        bVar9 = uVar7 < uVar8;
        lVar6 = (-(ulong)(uVar8 == 0) - uVar8) + uVar7;
        uVar7 = uVar7 + 1;
      } while (lVar6 != 0);
    }
    if (bVar9) {
      return local_8c;
    }
  }
  logAndPropagateResult("zesRasClearStateExp",zVar5);
  return zVar5;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesRasClearStateExp(
        zes_ras_handle_t hRas,                          ///< [in] Handle for the component.
        zes_ras_error_category_exp_t category           ///< [in] category for which error counter is to be cleared.
        )
    {
        context.logger->log_trace("zesRasClearStateExp(hRas, category)");

        auto pfnClearStateExp = context.zesDdiTable.RasExp.pfnClearStateExp;

        if( nullptr == pfnClearStateExp )
            return logAndPropagateResult("zesRasClearStateExp", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesRasClearStateExpPrologue( hRas, category );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesRasClearStateExp", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zesHandleLifetime.zesRasClearStateExpPrologue( hRas, category );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesRasClearStateExp", result);
        }

        auto driver_result = pfnClearStateExp( hRas, category );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesRasClearStateExpEpilogue( hRas, category ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesRasClearStateExp", result);
        }

        return logAndPropagateResult("zesRasClearStateExp", driver_result);
    }